

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_precision_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  SPIRType *type_00;
  uint32_t id_00;
  mapped_type *pmVar1;
  TypedID<(diligent_spirv_cross::Types)0> local_50 [5];
  allocator local_39;
  SPIRType *local_38;
  SPIRType *result_type;
  SPIRType *pSStack_28;
  bool use_precision_qualifiers;
  SPIRType *type;
  CompilerGLSL *pCStack_18;
  uint32_t id_local;
  CompilerGLSL *this_local;
  
  type._4_4_ = id;
  pCStack_18 = this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  pSStack_28 = Compiler::expression_type(&this->super_Compiler,id);
  result_type._7_1_ = (this->backend).allow_precision_qualifiers & 1;
  if ((result_type._7_1_ != 0) &&
     ((pSStack_28->basetype == Image || (pSStack_28->basetype == SampledImage)))) {
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_28->image);
    local_38 = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,id_00);
    if (local_38->width < 0x20) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"mediump ",&local_39);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
      return __return_storage_ptr__;
    }
  }
  type_00 = pSStack_28;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID(local_50,type._4_4_);
  pmVar1 = ::std::
           unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_Compiler).ir.meta,local_50);
  flags_to_qualifiers_glsl_abi_cxx11_
            (__return_storage_ptr__,this,type_00,&(pmVar1->decoration).decoration_flags);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::to_precision_qualifiers_glsl(uint32_t id)
{
	auto &type = expression_type(id);
	bool use_precision_qualifiers = backend.allow_precision_qualifiers;
	if (use_precision_qualifiers && (type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage))
	{
		// Force mediump for the sampler type. We cannot declare 16-bit or smaller image types.
		auto &result_type = get<SPIRType>(type.image.type);
		if (result_type.width < 32)
			return "mediump ";
	}
	return flags_to_qualifiers_glsl(type, ir.meta[id].decoration.decoration_flags);
}